

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateNonConfigurableLdRootFld(Lowerer *this,Instr *instrLdFld)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  uint sourceContextId;
  uint functionId;
  DWORD DVar4;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_02;
  intptr_t iVar6;
  RegOpnd *baseOpnd;
  MemRefOpnd *src;
  IndirOpnd *newSrc;
  
  this_00 = IR::Opnd::AsSymOpnd(instrLdFld->m_src1);
  bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar2) {
    return false;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrLdFld->m_src1);
  bVar2 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_01);
  if (!bVar2) {
    return false;
  }
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,RootObjectFldFastPathPhase,sourceContextId,functionId);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x197f,
                       "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::RootObjectFldFastPathPhase)), ((this->m_func)->GetSourceContextId()), ((this->m_func)->GetLocalFunctionId())))"
                       ,"!PHASE_OFF(Js::RootObjectFldFastPathPhase, this->m_func)");
    if (!bVar2) goto LAB_00569083;
    *puVar5 = 0;
  }
  if (((instrLdFld->field_0x38 & 0x10) != 0) &&
     (bVar2 = IR::Instr::HasLazyBailOut(instrLdFld), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1980,"(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut())",
                       "!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut()");
    if (!bVar2) {
LAB_00569083:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = IR::Instr::HasLazyBailOut(instrLdFld);
  if (bVar2) {
    IR::Instr::ClearBailOutInfo(instrLdFld);
  }
  this_02 = Func::GetJITFunctionBody(this->m_func);
  iVar6 = JITTimeFunctionBody::GetRootObject(this_02);
  if (((this_01->field_0x61 & 1) == 0) || (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0)
     ) {
    uVar3 = IR::PropertySymOpnd::GetSlotIndex(this_01);
    newSrc = (IndirOpnd *)
             IR::MemRefOpnd::New((void *)((ulong)uVar3 * 8 + iVar6),TyVar,this->m_func,
                                 AddrOpndKindDynamicMisc);
  }
  else {
    baseOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    DVar4 = Js::DynamicObject::GetOffsetOfAuxSlots();
    src = IR::MemRefOpnd::New((void *)(iVar6 + (ulong)DVar4),TyUint64,this->m_func,
                              AddrOpndKindDynamicMisc);
    InsertMove(&baseOpnd->super_Opnd,&src->super_Opnd,instrLdFld,true);
    uVar3 = IR::PropertySymOpnd::GetSlotIndex(this_01);
    newSrc = IR::IndirOpnd::New(baseOpnd,(uint)uVar3 << 3,TyVar,this->m_func,false);
  }
  IR::Instr::ReplaceSrc1(instrLdFld,&newSrc->super_Opnd);
  instrLdFld->m_opcode = Ld_A;
  LowererMD::ChangeToAssign(instrLdFld);
  return true;
}

Assistant:

bool
Lowerer::GenerateNonConfigurableLdRootFld(IR::Instr * instrLdFld)
{
    if (!instrLdFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return false;
    }
    IR::PropertySymOpnd *propertySymOpnd = instrLdFld->GetSrc1()->AsPropertySymOpnd();
    if (!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())
    {
        return false;
    }

    Assert(!PHASE_OFF(Js::RootObjectFldFastPathPhase, this->m_func));
    Assert(!instrLdFld->HasBailOutInfo() || instrLdFld->HasLazyBailOut());

    if (instrLdFld->HasLazyBailOut())
    {
        instrLdFld->ClearBailOutInfo();
    }

    IR::Opnd * srcOpnd;
    intptr_t rootObject = this->m_func->GetJITFunctionBody()->GetRootObject();
    if (propertySymOpnd->UsesAuxSlot())
    {
        IR::RegOpnd * auxSlotOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
        this->InsertMove(auxSlotOpnd, IR::MemRefOpnd::New((byte *)rootObject + Js::DynamicObject::GetOffsetOfAuxSlots(),
                TyMachPtr, this->m_func), instrLdFld);

        srcOpnd = IR::IndirOpnd::New(auxSlotOpnd, propertySymOpnd->GetSlotIndex() * sizeof(Js::Var *),
            TyVar, this->m_func);
    }
    else
    {
        srcOpnd = IR::MemRefOpnd::New((Js::Var *)rootObject + propertySymOpnd->GetSlotIndex(),
            TyVar, this->m_func);
    }
    instrLdFld->ReplaceSrc1(srcOpnd);
    instrLdFld->m_opcode = Js::OpCode::Ld_A;
    LowererMD::ChangeToAssign(instrLdFld);
    return true;
}